

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void initCompiler(Compiler *compiler,FunctionType type)

{
  int iVar1;
  ObjFunction *pOVar2;
  ObjString *pOVar3;
  char *pcVar4;
  
  compiler->enclosing = current;
  compiler->function = (ObjFunction *)0x0;
  compiler->type = type;
  compiler->localCount = 0;
  compiler->scopeDepth = 0;
  pOVar2 = newFunction();
  compiler->function = pOVar2;
  current = compiler;
  if (type != TYPE_SCRIPT) {
    pOVar3 = copyString(parser.previous.start,parser.previous.length);
    compiler = current;
    current->function->name = pOVar3;
  }
  iVar1 = compiler->localCount;
  compiler->localCount = iVar1 + 1;
  compiler->locals[iVar1].depth = 0;
  compiler->locals[iVar1].isCaptured = false;
  pcVar4 = "this";
  if (type == TYPE_FUNCTION) {
    pcVar4 = "";
  }
  compiler->locals[iVar1].name.start = pcVar4;
  compiler->locals[iVar1].name.length = (uint)(type != TYPE_FUNCTION) << 2;
  return;
}

Assistant:

static void initCompiler(Compiler *compiler, FunctionType type) {
    compiler->enclosing = current;
    compiler->function = NULL;
    compiler->type = type;
    compiler->localCount = 0;
    compiler->scopeDepth = 0;
    compiler->function = newFunction();
    current = compiler;

    if (type != TYPE_SCRIPT) {
        current->function->name = copyString(parser.previous.start, parser.previous.length);
    }

    Local *local = &current->locals[current->localCount++];
    local->depth = 0;
    local->isCaptured = false;
    if (type != TYPE_FUNCTION) {
        local->name.start = "this";
        local->name.length = 4;
    } else {
        local->name.start = "";
        local->name.length = 0;
    }
}